

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_dictionary.cc
# Opt level: O1

void LabelDict::del_example_namespaces_from_example(example *target,example *source)

{
  byte ns;
  uchar *puVar1;
  byte *pbVar2;
  
  puVar1 = (source->super_example_predict).indices._end;
  if ((puVar1 != (source->super_example_predict).indices._begin) &&
     (pbVar2 = puVar1 + -1, (source->super_example_predict).indices._begin <= pbVar2)) {
    do {
      ns = *pbVar2;
      if ((ulong)ns != 0x80) {
        del_example_namespace(target,ns,(source->super_example_predict).feature_space + ns);
      }
      pbVar2 = pbVar2 + -1;
    } while ((source->super_example_predict).indices._begin <= pbVar2);
  }
  return;
}

Assistant:

void del_example_namespaces_from_example(example& target, example& source)
{
  if (source.indices.size() == 0)  // making sure we can deal with empty shared example
    return;
  namespace_index* idx = source.indices.end();
  idx--;
  for (; idx >= source.indices.begin(); idx--)
  {
    if (*idx == constant_namespace)
      continue;
    del_example_namespace(target, *idx, source.feature_space[*idx]);
  }
}